

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

ArrayFeatureType_Shape *
google::protobuf::internal::GenericTypeHandler<CoreML::Specification::ArrayFeatureType_Shape>::New
          (Arena *arena)

{
  Arena *arena_local;
  ArrayFeatureType_Shape *local_28;
  ArrayFeatureType_Shape *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (ArrayFeatureType_Shape *)operator_new(0x28);
    CoreML::Specification::ArrayFeatureType_Shape::ArrayFeatureType_Shape(local_28);
  }
  else {
    local_28 = (ArrayFeatureType_Shape *)
               Arena::AllocateAligned
                         (arena,(type_info *)
                                &CoreML::Specification::ArrayFeatureType_Shape::typeinfo,0x28);
    CoreML::Specification::ArrayFeatureType_Shape::ArrayFeatureType_Shape(local_28);
    Arena::AddListNode(arena,local_28,
                       arena_destruct_object<CoreML::Specification::ArrayFeatureType_Shape>);
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }